

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.c
# Opt level: O2

void av1_init_tpl_stats(TplParams *tpl_data)

{
  long lVar1;
  TplDepStats **ppTVar2;
  
  tpl_data->ready = 0;
  tpl_data->tpl_stats_block_mis_log2 = '\x02';
  tpl_data->tpl_bsize_1d = '\x10';
  for (lVar1 = 8; lVar1 != 0x2768; lVar1 = lVar1 + 0x60) {
    *(undefined1 *)((long)tpl_data->tpl_stats_buffer[0].ref_map_index + lVar1 + -0x28) = 0;
  }
  ppTVar2 = tpl_data->tpl_stats_pool;
  for (lVar1 = 10; lVar1 != 0x24a; lVar1 = lVar1 + 0xc) {
    if (*ppTVar2 != (TplDepStats *)0x0) {
      memset(*ppTVar2,0,
             (long)tpl_data->tpl_stats_buffer[0].ref_map_index[lVar1 * 2 + -0xb] *
             (long)tpl_data->tpl_stats_buffer[0].ref_map_index[lVar1 * 2 + -10] * 200);
    }
    ppTVar2 = ppTVar2 + 1;
  }
  return;
}

Assistant:

void av1_init_tpl_stats(TplParams *const tpl_data) {
  tpl_data->ready = 0;
  set_tpl_stats_block_size(&tpl_data->tpl_stats_block_mis_log2,
                           &tpl_data->tpl_bsize_1d);
  for (int frame_idx = 0; frame_idx < MAX_LENGTH_TPL_FRAME_STATS; ++frame_idx) {
    TplDepFrame *tpl_frame = &tpl_data->tpl_stats_buffer[frame_idx];
    tpl_frame->is_valid = 0;
  }
  for (int frame_idx = 0; frame_idx < MAX_LAG_BUFFERS; ++frame_idx) {
    TplDepFrame *tpl_frame = &tpl_data->tpl_stats_buffer[frame_idx];
    if (tpl_data->tpl_stats_pool[frame_idx] == NULL) continue;
    memset(tpl_data->tpl_stats_pool[frame_idx], 0,
           tpl_frame->height * tpl_frame->width *
               sizeof(*tpl_frame->tpl_stats_ptr));
  }
}